

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_ISXD.cpp
# Opt level: O3

h__Writer * __thiscall AS_02::ISXD::MXFWriter::h__Writer::Finalize(h__Writer *this)

{
  ILogSink *this_00;
  long in_RSI;
  
  if (*(int *)(in_RSI + 0x370) == 3) {
    *(undefined4 *)(in_RSI + 0x370) = 4;
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    if (-1 < *(int *)&(this->super_h__AS02WriterFrame).
                      super_h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR>.
                      super_TrackFileWriter<ASDCP::MXF::OP1aHeader>._vptr_TrackFileWriter) {
      h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR>::WriteAS02Footer
                ((h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR> *)&stack0xffffffffffffff88);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff88);
      Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff88);
    }
  }
  else {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error
              (this_00,"RESULT_STATE RETURNED at %s (%d)\n",
               "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_ISXD.cpp"
               ,0x186);
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  return this;
}

Assistant:

Result_t
AS_02::ISXD::MXFWriter::h__Writer::Finalize()
{
  if ( ! m_State.Test_RUNNING() )
    {
      KM_RESULT_STATE_HERE();
	return RESULT_STATE;
    }

  Result_t result = m_State.Goto_FINAL();

  if ( KM_SUCCESS(result) )
    {
      result = WriteAS02Footer();
    }

  return result;
}